

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O0

boolean place_level(int proto_index,proto_dungeon *pd)

{
  s_level *psVar1;
  xchar xVar2;
  boolean bVar3;
  int nth;
  int local_54;
  int npossible;
  s_level *lev;
  boolean map [33];
  proto_dungeon *pd_local;
  int proto_index_local;
  
  if (proto_index == pd->n_levs) {
    pd_local._7_1_ = '\x01';
  }
  else {
    psVar1 = pd->final_lev[proto_index];
    if (psVar1 == (s_level *)0x0) {
      pd_local._7_1_ = place_level(proto_index + 1,pd);
    }
    else {
      for (local_54 = possible_places(proto_index,(boolean *)&lev,pd); local_54 != 0;
          local_54 = local_54 + -1) {
        nth = rn2(local_54);
        xVar2 = pick_level((boolean *)&lev,nth);
        (psVar1->dlevel).dlevel = xVar2;
        bVar3 = place_level(proto_index + 1,pd);
        if (bVar3 != '\0') {
          return '\x01';
        }
        map[(long)(psVar1->dlevel).dlevel + -8] = '\0';
      }
      pd_local._7_1_ = '\0';
    }
  }
  return pd_local._7_1_;
}

Assistant:

static boolean place_level(int proto_index, struct proto_dungeon *pd)
{
    boolean map[MAXLEVEL+1];	/* valid levels are 1..MAXLEVEL inclusive */
    s_level *lev;
    int npossible;

    if (proto_index == pd->n_levs) return TRUE;	/* at end of proto levels */

    lev = pd->final_lev[proto_index];

    /* No level created for this prototype, goto next. */
    if (!lev) return place_level(proto_index+1, pd);

    npossible = possible_places(proto_index, map, pd);

    for (; npossible; --npossible) {
	lev->dlevel.dlevel = pick_level(map, rn2(npossible));
	if (place_level(proto_index+1, pd))
	    return TRUE;

	map[lev->dlevel.dlevel] = FALSE;	/* this choice didn't work */
    }
    return FALSE;
}